

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O2

void jpc_rct(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  jas_seqent_t *pjVar4;
  jas_seqent_t *pjVar5;
  jas_seqent_t *pjVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  iVar7 = (int)c0->numrows_;
  if (c1->numrows_ == (long)iVar7) {
    uVar3 = c0->numcols_;
    if (((c1->numcols_ == (long)(int)uVar3) && (c2->numrows_ == c1->numrows_)) &&
       (c2->numcols_ == c1->numcols_)) {
      uVar11 = 0;
      uVar8 = c0->numrows_ & 0xffffffff;
      if (iVar7 < 1) {
        uVar8 = uVar11;
      }
      for (; uVar11 != uVar8; uVar11 = uVar11 + 1) {
        pjVar4 = c0->rows_[uVar11];
        pjVar5 = c1->rows_[uVar11];
        pjVar6 = c2->rows_[uVar11];
        lVar9 = 0;
        for (uVar10 = uVar3 & 0xffffffff; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
          iVar7 = *(int *)((long)pjVar4 + lVar9);
          iVar1 = *(int *)((long)pjVar5 + lVar9);
          iVar2 = *(int *)((long)pjVar6 + lVar9);
          *(long *)((long)pjVar4 + lVar9) = (long)(iVar7 + iVar1 * 2 + iVar2 >> 2);
          *(long *)((long)pjVar5 + lVar9) = (long)(iVar2 - iVar1);
          *(long *)((long)pjVar6 + lVar9) = (long)(iVar7 - iVar1);
          lVar9 = lVar9 + 8;
        }
      }
      return;
    }
  }
  __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0x67,"void jpc_rct(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_rct(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	numcols = jas_matrix_numcols(c0);

	/* All three matrices must have the same dimensions. */
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols
	  && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols);

	for (i = 0; i < numrows; i++) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			int r;
			int g;
			int b;
			int y;
			int u;
			int v;
			r = *c0p;
			g = *c1p;
			b = *c2p;
			//y = (r + (g << 1) + b) >> 2;
			y = jpc_fix_asr(r + jpc_fix_asl(g, 1) + b, 2);
			u = b - g;
			v = r - g;
			*c0p++ = y;
			*c1p++ = u;
			*c2p++ = v;
		}
	}
}